

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFVerifier.cpp
# Opt level: O1

bool isVariableIndexable(DWARFDie *Die,DWARFContext *DCtx)

{
  bool *this;
  void *pvVar1;
  uint uVar2;
  ArrayRef<unsigned_char> D;
  bool bVar3;
  DWARFDebugLoc *this_00;
  LocationList *pLVar4;
  long lVar5;
  void *pvVar6;
  void *pvVar7;
  ArrayRef<unsigned_char> D_00;
  ArrayRef<unsigned_char> D_01;
  ArrayRef<unsigned_char> D_02;
  ArrayRef<unsigned_char> D_03;
  ArrayRef<unsigned_char> D_04;
  ArrayRef<unsigned_char> D_05;
  ArrayRef<unsigned_char> D_06;
  Optional<unsigned_long> OVar8;
  ArrayRef<llvm::dwarf::Attribute> Attrs;
  undefined1 local_90 [8];
  Optional<llvm::DWARFFormValue> Location;
  Optional<llvm::ArrayRef<unsigned_char>_> Expr;
  anon_class_16_2_209e955a ContainsInterestingOperators;
  
  Location.Storage.hasVal = true;
  Location.Storage._49_1_ = 0;
  Attrs.Length = 1;
  Attrs.Data = (Attribute *)&Location.Storage.hasVal;
  llvm::DWARFDie::findRecursively((Optional<llvm::DWARFFormValue> *)local_90,Die,Attrs);
  if (Location.Storage.field_0._40_1_ != '\x01') {
    return false;
  }
  Expr.Storage._16_8_ = Die;
  llvm::DWARFFormValue::getAsBlock
            ((Optional<llvm::ArrayRef<unsigned_char>_> *)&Location.Storage.hasVal,
             (DWARFFormValue *)local_90);
  if (Expr.Storage.field_0.value.Length._0_1_ == '\x01') {
    D._2_14_ = stack0xffffffffffffffaa;
    D.Data._0_1_ = Location.Storage.hasVal;
    D.Data._1_1_ = Location.Storage._49_1_;
    bVar3 = isVariableIndexable::anon_class_16_2_209e955a::operator()
                      ((anon_class_16_2_209e955a *)&Expr.Storage.hasVal,D);
    if (!bVar3) {
      return false;
    }
    return true;
  }
  if (Location.Storage.field_0._40_1_ == '\0') {
    __assert_fail("hasVal",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/include/llvm/ADT/Optional.h"
                  ,0xad,
                  "T &llvm::optional_detail::OptionalStorage<llvm::DWARFFormValue>::getValue() & [T = llvm::DWARFFormValue]"
                 );
  }
  OVar8 = llvm::DWARFFormValue::getAsSectionOffset((DWARFFormValue *)local_90);
  if (((undefined1  [16])OVar8.Storage & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    return false;
  }
  this_00 = llvm::DWARFContext::getDebugLoc(DCtx);
  if (this_00 == (DWARFDebugLoc *)0x0) {
    return false;
  }
  pLVar4 = llvm::DWARFDebugLoc::getLocationListAtOffset(this_00,OVar8.Storage.field_0.value);
  if (pLVar4 == (LocationList *)0x0) {
    return false;
  }
  pvVar6 = (pLVar4->Entries).super_SmallVectorImpl<llvm::DWARFDebugLoc::Entry>.
           super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>.
           super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.super_SmallVectorBase.
           BeginX;
  uVar2 = (pLVar4->Entries).super_SmallVectorImpl<llvm::DWARFDebugLoc::Entry>.
          super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>.
          super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.super_SmallVectorBase.
          Size;
  pvVar1 = (void *)((long)pvVar6 + (ulong)uVar2 * 0x28);
  if (3 < (ulong)uVar2) {
    lVar5 = (ulong)(uVar2 >> 2) + 1;
    this = &Expr.Storage.hasVal;
    pvVar6 = (void *)((long)pvVar6 + 0x50);
    do {
      pvVar7 = pvVar6;
      D_02.Length._4_4_ = 0;
      D_02._0_12_ = *(undefined1 (*) [12])((long)pvVar7 + -0x40);
      bVar3 = isVariableIndexable::anon_class_16_2_209e955a::operator()
                        ((anon_class_16_2_209e955a *)this,D_02);
      if (bVar3) {
        pvVar7 = (void *)((long)pvVar7 + -0x50);
        goto LAB_00b1fc3f;
      }
      D_03.Length._4_4_ = 0;
      D_03._0_12_ = *(undefined1 (*) [12])((long)pvVar7 + -0x18);
      bVar3 = isVariableIndexable::anon_class_16_2_209e955a::operator()
                        ((anon_class_16_2_209e955a *)this,D_03);
      if (bVar3) {
        pvVar7 = (void *)((long)pvVar7 + -0x28);
        goto LAB_00b1fc3f;
      }
      D_04.Length._4_4_ = 0;
      D_04._0_12_ = *(undefined1 (*) [12])((long)pvVar7 + 0x10);
      bVar3 = isVariableIndexable::anon_class_16_2_209e955a::operator()
                        ((anon_class_16_2_209e955a *)this,D_04);
      if (bVar3) goto LAB_00b1fc3f;
      D_05.Length._4_4_ = 0;
      D_05._0_12_ = *(undefined1 (*) [12])((long)pvVar7 + 0x38);
      bVar3 = isVariableIndexable::anon_class_16_2_209e955a::operator()
                        ((anon_class_16_2_209e955a *)this,D_05);
      if (bVar3) {
        pvVar7 = (void *)((long)pvVar7 + 0x28);
        goto LAB_00b1fc3f;
      }
      lVar5 = lVar5 + -1;
      pvVar6 = (void *)((long)pvVar7 + 0xa0);
    } while (1 < lVar5);
    pvVar6 = (void *)((long)pvVar7 + 0x50);
  }
  lVar5 = ((long)pvVar1 - (long)pvVar6 >> 3) * -0x3333333333333333;
  if (lVar5 != 1) {
    if (lVar5 != 2) {
      pvVar7 = pvVar1;
      if ((lVar5 != 3) ||
         (D_00.Length._4_4_ = 0, D_00._0_12_ = *(undefined1 (*) [12])((long)pvVar6 + 0x10),
         bVar3 = isVariableIndexable::anon_class_16_2_209e955a::operator()
                           ((anon_class_16_2_209e955a *)&Expr.Storage.hasVal,D_00), pvVar7 = pvVar6,
         bVar3)) goto LAB_00b1fc3f;
      pvVar6 = (void *)((long)pvVar6 + 0x28);
    }
    D_01.Length._4_4_ = 0;
    D_01._0_12_ = *(undefined1 (*) [12])((long)pvVar6 + 0x10);
    bVar3 = isVariableIndexable::anon_class_16_2_209e955a::operator()
                      ((anon_class_16_2_209e955a *)&Expr.Storage.hasVal,D_01);
    pvVar7 = pvVar6;
    if (bVar3) goto LAB_00b1fc3f;
    pvVar6 = (void *)((long)pvVar6 + 0x28);
  }
  D_06.Length._4_4_ = 0;
  D_06._0_12_ = *(undefined1 (*) [12])((long)pvVar6 + 0x10);
  bVar3 = isVariableIndexable::anon_class_16_2_209e955a::operator()
                    ((anon_class_16_2_209e955a *)&Expr.Storage.hasVal,D_06);
  pvVar7 = pvVar6;
  if (!bVar3) {
    pvVar7 = pvVar1;
  }
LAB_00b1fc3f:
  if (pvVar7 == pvVar1) {
    return false;
  }
  return true;
}

Assistant:

static bool isVariableIndexable(const DWARFDie &Die, DWARFContext &DCtx) {
  Optional<DWARFFormValue> Location = Die.findRecursively(DW_AT_location);
  if (!Location)
    return false;

  auto ContainsInterestingOperators = [&](ArrayRef<uint8_t> D) {
    DWARFUnit *U = Die.getDwarfUnit();
    DataExtractor Data(toStringRef(D), DCtx.isLittleEndian(), U->getAddressByteSize());
    DWARFExpression Expression(Data, U->getVersion(), U->getAddressByteSize());
    return any_of(Expression, [](DWARFExpression::Operation &Op) {
      return !Op.isError() && (Op.getCode() == DW_OP_addr ||
                               Op.getCode() == DW_OP_form_tls_address ||
                               Op.getCode() == DW_OP_GNU_push_tls_address);
    });
  };

  if (Optional<ArrayRef<uint8_t>> Expr = Location->getAsBlock()) {
    // Inlined location.
    if (ContainsInterestingOperators(*Expr))
      return true;
  } else if (Optional<uint64_t> Offset = Location->getAsSectionOffset()) {
    // Location list.
    if (const DWARFDebugLoc *DebugLoc = DCtx.getDebugLoc()) {
      if (const DWARFDebugLoc::LocationList *LocList =
              DebugLoc->getLocationListAtOffset(*Offset)) {
        if (any_of(LocList->Entries, [&](const DWARFDebugLoc::Entry &E) {
              return ContainsInterestingOperators(E.Loc);
            }))
          return true;
      }
    }
  }
  return false;
}